

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O0

void __thiscall QHeaderViewPrivate::prepareSectionSelected(QHeaderViewPrivate *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  qsizetype qVar4;
  long in_RDI;
  QBitArray *unaff_retaddr;
  QHeaderViewPrivate *in_stack_ffffffffffffffe0;
  long lVar5;
  undefined1 aval;
  
  lVar5 = in_RDI;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x845793);
  aval = (undefined1)((ulong)lVar5 >> 0x38);
  if (bVar1) {
    QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8457aa);
    uVar3 = QItemSelectionModel::hasSelection();
    if ((uVar3 & 1) != 0) {
      qVar4 = QBitArray::size((QBitArray *)in_stack_ffffffffffffffe0);
      iVar2 = sectionCount(in_stack_ffffffffffffffe0);
      if (qVar4 != iVar2 << 1) {
        sectionCount((QHeaderViewPrivate *)(in_RDI + 0x588));
        QBitArray::fill(unaff_retaddr,(bool)aval,in_RDI);
        return;
      }
      QBitArray::fill(unaff_retaddr,(bool)aval,in_RDI);
      return;
    }
  }
  QBitArray::clear((QBitArray *)0x8457c7);
  return;
}

Assistant:

inline void prepareSectionSelected() {
        if (!selectionModel || !selectionModel->hasSelection())
            sectionSelected.clear();
        else if (sectionSelected.size() != sectionCount() * 2)
            sectionSelected.fill(false, sectionCount() * 2);
        else sectionSelected.fill(false);
    }